

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glDeleteShader(MOJOSHADER_glShader *shader)

{
  long *key_00;
  int iVar1;
  void *key;
  void *iter;
  long *local_38;
  void *local_30;
  
  if (ctx->linker_cache != (HashTable *)0x0) {
    local_38 = (long *)0x0;
    local_30 = (void *)0x0;
    iVar1 = hash_iter_keys(ctx->linker_cache,&local_38,&local_30);
    if (iVar1 != 0) {
      do {
        key_00 = local_38;
        iVar1 = hash_iter_keys(ctx->linker_cache,&local_38,&local_30);
        if (((MOJOSHADER_glShader *)*key_00 == shader) ||
           ((MOJOSHADER_glShader *)key_00[1] == shader)) {
          hash_remove(ctx->linker_cache,key_00);
        }
      } while (iVar1 != 0);
    }
  }
  shader_unref(shader);
  return;
}

Assistant:

void MOJOSHADER_glDeleteShader(MOJOSHADER_glShader *shader)
{
    // See if this was bound as an unlinked program anywhere...
    if (ctx->linker_cache)
    {
        const void *key = NULL;
        void *iter = NULL;
        int morekeys = hash_iter_keys(ctx->linker_cache, &key, &iter);
        while (morekeys)
        {
            const BoundShaders *shaders = (const BoundShaders *) key;
            // Do this here so we don't confuse the iteration by removing...
            morekeys = hash_iter_keys(ctx->linker_cache, &key, &iter);
            if ((shaders->vertex == shader) || (shaders->fragment == shader))
            {
                // Deletes the linked program, which will unref the shader.
                hash_remove(ctx->linker_cache, shaders);
            } // if
        } // while
    } // if

    shader_unref(shader);
}